

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.hpp
# Opt level: O3

void __thiscall
optimization::sanity_check::SanityCheck::optimize_func(SanityCheck *this,MirFunction *func)

{
  long *plVar1;
  undefined **ppuVar2;
  long lVar3;
  _Base_ptr p_Var4;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  _Rb_tree_color bb;
  _Base_ptr p_Var8;
  long lVar9;
  anon_class_8_1_898bcfc2 check;
  Value v;
  anon_class_8_1_898bcfc2 local_258;
  undefined1 local_250 [24];
  char local_238;
  undefined2 local_237;
  _Base_ptr local_230;
  VarId local_228;
  undefined **local_218;
  undefined **local_210;
  undefined **local_208;
  _Base_ptr local_200;
  undefined **local_1f8;
  undefined **local_1f0;
  undefined **local_1e8;
  undefined **local_1e0;
  undefined **local_1d8;
  undefined **local_1d0;
  undefined **local_1c8;
  _Base_ptr local_1c0;
  _Base_ptr local_1b8;
  undefined **local_1b0;
  _func_int *local_1a8;
  uint32_t local_1a0;
  char local_198;
  undefined2 local_197;
  VarId local_190;
  undefined **local_180;
  _func_int *local_178;
  uint32_t local_170;
  char local_168;
  undefined2 local_167;
  undefined **local_160;
  _func_int *local_158;
  uint32_t local_150;
  char local_148;
  undefined2 local_147;
  undefined **local_140;
  _func_int *local_138;
  uint32_t local_130;
  char local_128;
  undefined2 local_127;
  undefined **local_120;
  _func_int *local_118;
  uint32_t local_110;
  char local_108;
  undefined2 local_107;
  undefined **local_100;
  _func_int *local_f8;
  uint32_t local_f0;
  char local_e8;
  undefined2 local_e7;
  undefined **local_e0;
  _func_int *local_d8;
  uint32_t local_d0;
  char local_c8;
  undefined2 local_c7;
  undefined **local_c0;
  _func_int *local_b8;
  uint32_t local_b0;
  char local_a8;
  undefined2 local_a7;
  undefined **local_a0;
  _func_int *local_98;
  uint32_t local_90;
  char local_88;
  undefined2 local_87;
  undefined **local_80;
  _func_int *local_78;
  uint32_t local_70;
  char local_68;
  undefined2 local_67;
  undefined **local_60;
  _func_int *local_58;
  uint32_t local_50;
  char local_48;
  undefined2 local_47;
  VarId local_40;
  
  local_230 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_230 != local_200) {
    local_1c8 = &PTR_display_001ed048;
    local_1d0 = &PTR_display_001ed108;
    local_1d8 = &PTR_display_001ecfe8;
    local_1e0 = &PTR_display_001ed1c8;
    local_1e8 = &PTR_display_001ed288;
    local_1f0 = &PTR_display_001ed228;
    local_1f8 = &PTR_display_001ed2e8;
    local_208 = &PTR_display_001ed168;
    local_210 = &PTR_display_001ed3a8;
    local_218 = &PTR_display_001ed348;
    local_258.func = func;
    do {
      p_Var8 = local_230[3]._M_parent;
      local_1c0 = local_230[3]._M_left;
      if (p_Var8 != local_1c0) {
        do {
          p_Var4 = local_230;
          plVar1 = *(long **)p_Var8;
          local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          local_40.id = *(uint32_t *)(plVar1 + 2);
          optimize_func::anon_class_8_1_898bcfc2::operator()
                    (&local_258,&local_40,local_230[1]._M_color);
          ppuVar2 = (undefined **)*plVar1;
          local_1b8 = p_Var8;
          if (ppuVar2 == local_1c8) {
            local_48 = (char)plVar1[6];
            local_250._0_8_ = &local_58;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_48 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_60 = &PTR_display_001ecf98;
            local_47 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_48 == '\x01') {
              local_250._0_8_ = &PTR_display_001eb100;
              local_250._8_4_ = local_50;
              optimize_func::anon_class_8_1_898bcfc2::operator()
                        (&local_258,(VarId *)local_250,p_Var4[1]._M_color);
            }
            local_68 = (char)plVar1[10];
            local_250._0_8_ = &local_78;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_68 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 8));
            local_80 = &PTR_display_001ecf98;
            local_67 = *(undefined2 *)((long)plVar1 + 0x51);
            if (local_68 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_70;
              goto LAB_0011cbb8;
            }
          }
          else if (ppuVar2 == local_1d0) {
            lVar3 = plVar1[8];
            for (lVar9 = plVar1[7]; lVar9 != lVar3; lVar9 = lVar9 + 0x20) {
              local_238 = *(char *)(lVar9 + 0x18);
              local_228.super_Displayable._vptr_Displayable = (_func_int **)(local_250 + 8);
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr[(long)local_238 + 1]._M_data)
                        ((anon_class_8_1_a78179b7_conflict *)&local_228,
                         (variant<int,_mir::inst::VarId> *)(lVar9 + 8));
              local_250._0_8_ = &PTR_display_001ecf98;
              local_237 = *(undefined2 *)(lVar9 + 0x19);
              local_88 = local_238;
              local_228.super_Displayable._vptr_Displayable = &local_98;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr[(long)local_238 + 1]._M_data)
                        ((anon_class_8_1_a78179b7_conflict *)&local_228,
                         (variant<int,_mir::inst::VarId> *)(local_250 + 8));
              local_a0 = &PTR_display_001ecf98;
              local_87 = local_237;
              if (local_88 == '\x01') {
                local_228.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_228.id = local_90;
                optimize_func::anon_class_8_1_898bcfc2::operator()
                          (&local_258,&local_228,local_230[1]._M_color);
              }
            }
          }
          else if (ppuVar2 == local_1d8) {
            local_a8 = (char)plVar1[6];
            local_250._0_8_ = &local_b8;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_a8 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_c0 = &PTR_display_001ecf98;
            local_a7 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_a8 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_b0;
LAB_0011cbb8:
              local_250._0_8_ = &PTR_display_001eb100;
              optimize_func::anon_class_8_1_898bcfc2::operator()(&local_258,(VarId *)local_250,bb);
            }
          }
          else if (ppuVar2 == local_1e0) {
            local_c8 = (char)plVar1[6];
            local_250._0_8_ = &local_d8;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_c8 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_e0 = &PTR_display_001ecf98;
            local_c7 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_c8 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_d0;
              goto LAB_0011cbb8;
            }
          }
          else if (ppuVar2 == local_1e8) {
            local_e8 = (char)plVar1[6];
            local_250._0_8_ = &local_f8;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_e8 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_100 = &PTR_display_001ecf98;
            local_e7 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_e8 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_f0;
              goto LAB_0011cbb8;
            }
          }
          else if (ppuVar2 == local_1f0) {
            local_108 = (char)plVar1[6];
            local_250._0_8_ = &local_118;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_108 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_120 = &PTR_display_001ecf98;
            local_107 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_108 == '\x01') {
              local_250._0_8_ = &PTR_display_001eb100;
              local_250._8_4_ = local_110;
              optimize_func::anon_class_8_1_898bcfc2::operator()
                        (&local_258,(VarId *)local_250,p_Var4[1]._M_color);
            }
            local_128 = (char)plVar1[10];
            local_250._0_8_ = &local_138;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_128 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 8));
            local_140 = &PTR_display_001ecf98;
            local_127 = *(undefined2 *)((long)plVar1 + 0x51);
            if (local_128 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_130;
              goto LAB_0011cbb8;
            }
          }
          else if (ppuVar2 == local_1f8) {
            local_148 = (char)plVar1[6];
            local_250._0_8_ = &local_158;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_148 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_160 = &PTR_display_001ecf98;
            local_147 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_148 == '\x01') {
              local_250._0_8_ = &PTR_display_001eb100;
              local_250._8_4_ = local_150;
              optimize_func::anon_class_8_1_898bcfc2::operator()
                        (&local_258,(VarId *)local_250,p_Var4[1]._M_color);
            }
            local_168 = (char)plVar1[10];
            local_250._0_8_ = &local_178;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_168 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 8));
            local_180 = &PTR_display_001ecf98;
            local_167 = *(undefined2 *)((long)plVar1 + 0x51);
            if (local_168 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_170;
              goto LAB_0011cbb8;
            }
          }
          else if (ppuVar2 == local_208) {
            if ((char)plVar1[7] == '\0') {
              pvVar5 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                 ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(plVar1 + 3));
              local_250._8_4_ = pvVar5->id;
              bb = local_230[1]._M_color;
              goto LAB_0011cbb8;
            }
          }
          else if (ppuVar2 == local_210) {
            lVar3 = plVar1[6];
            for (lVar9 = plVar1[5]; lVar9 != lVar3; lVar9 = lVar9 + 0x10) {
              local_190.id = *(uint32_t *)(lVar9 + 8);
              local_190.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
              optimize_func::anon_class_8_1_898bcfc2::operator()
                        (&local_258,&local_190,local_230[1]._M_color);
            }
          }
          else {
            if (ppuVar2 != local_218) {
              puVar6 = (undefined8 *)__cxa_allocate_exception(8);
              puVar7 = (undefined8 *)operator_new(8);
              *puVar7 = std::__throw_invalid_argument;
              *puVar6 = puVar7;
              __cxa_throw(puVar6,&std::bad_cast*::typeinfo,0);
            }
            local_250._8_4_ = *(undefined4 *)(plVar1 + 4);
            local_250._0_8_ = &PTR_display_001eb100;
            optimize_func::anon_class_8_1_898bcfc2::operator()
                      (&local_258,(VarId *)local_250,p_Var4[1]._M_color);
            local_198 = (char)plVar1[8];
            local_250._0_8_ = &local_1a8;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_198 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_250,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 6));
            local_1b0 = &PTR_display_001ecf98;
            local_197 = *(undefined2 *)((long)plVar1 + 0x41);
            if (local_198 == '\x01') {
              bb = p_Var4[1]._M_color;
              local_250._8_4_ = local_1a0;
              goto LAB_0011cbb8;
            }
          }
          p_Var8 = (_Base_ptr)&local_1b8->_M_parent;
        } while (p_Var8 != local_1c0);
      }
      local_230 = (_Base_ptr)std::_Rb_tree_increment(local_230);
    } while (local_230 != local_200);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction &func) {
    auto check = [&](mir::inst::VarId id, int bb) {
      if (func.variables.find(id) == func.variables.end()) {
        LOG(FATAL) << "No such variable: " << id << " (in: " << func.name
                   << ", bb " << bb << ")" << std::endl;
        func.variables.insert(
            {id.id, mir::inst::Variable(mir::types::new_int_ty())});
        // failed = true;
      }
    };
    auto check_val = [&](mir::inst::Value val, int bb) {
      if (auto id = val.get_if<mir::inst::VarId>()) {
        check(*id, bb);
      }
    };
    for (auto &bb : func.basic_blks) {
      for (auto &inst : bb.second.inst) {
        auto &i = *inst;
        check(i.dest, bb.first);
        if (auto x = dynamic_cast<mir::inst::OpInst *>(&i)) {
          check_val(x->lhs, bb.first);
          check_val(x->rhs, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::CallInst *>(&i)) {
          for (auto v : x->params) check_val(v, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::AssignInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::LoadInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::StoreInst *>(&i)) {
          check_val(x->val, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::LoadOffsetInst *>(&i)) {
          check_val(x->src, bb.first);
          check_val(x->offset, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::StoreOffsetInst *>(&i)) {
          check_val(x->val, bb.first);
          check_val(x->offset, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::RefInst *>(&i)) {
          if (x->val.index() == 0)
            check_val(std::get<0>(x->val), bb.first);
          else {
          }
        } else if (auto x = dynamic_cast<mir::inst::PhiInst *>(&i)) {
          for (auto v : x->vars) check(v, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst *>(&i)) {
          check_val(x->ptr, bb.first);
          check_val(x->offset, bb.first);
        } else {
          throw new std::bad_cast();
        }
      }
    }
  }